

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O0

void __thiscall
StringifyTest_DedupeSubstrings_Test::~StringifyTest_DedupeSubstrings_Test
          (StringifyTest_DedupeSubstrings_Test *this)

{
  StringifyTest_DedupeSubstrings_Test *this_local;
  
  ~StringifyTest_DedupeSubstrings_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(StringifyTest, DedupeSubstrings) {
  Module wasm;
  parseWast(wasm, dupModuleText);
  auto hashString = hashStringifyModule(&wasm);
  std::vector<SuffixTree::RepeatedSubstring> substrings =
    StringifyProcessor::repeatSubstrings(hashString);
  auto result = StringifyProcessor::dedupe(substrings);

  EXPECT_EQ(
    result,
    (std::vector<SuffixTree::RepeatedSubstring>{
      // 5, 6, 7, 6 appears at idx 12 and again at 28
      SuffixTree::RepeatedSubstring{4u, (std::vector<unsigned>{12, 28})},
      // 10, 11, 6 appears at idx 23 and again at 34
      SuffixTree::RepeatedSubstring{3u, (std::vector<unsigned>{23, 34})}}));
}